

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

int OSSL_PARAM_get_time_t(OSSL_PARAM *p,time_t *val)

{
  int iVar1;
  int64_t *unaff_retaddr;
  
  iVar1 = OSSL_PARAM_get_int64((OSSL_PARAM *)val,unaff_retaddr);
  return iVar1;
}

Assistant:

int OSSL_PARAM_get_time_t(const OSSL_PARAM *p, time_t *val)
{
#ifndef OPENSSL_SMALL_FOOTPRINT
    switch (sizeof(time_t)) {
    case sizeof(int32_t):
        return OSSL_PARAM_get_int32(p, (int32_t *)val);
    case sizeof(int64_t):
        return OSSL_PARAM_get_int64(p, (int64_t *)val);
    }
#endif
    return general_get_int(p, val, sizeof(*val));
}